

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

uint __thiscall capnp::compiler::NodeTranslator::StructLayout::Group::addPointer(Group *this)

{
  uint uVar1;
  size_t sVar2;
  uint *puVar3;
  Group *this_local;
  
  addMember(this);
  uVar1 = this->parentPointerLocationUsage;
  sVar2 = kj::Vector<unsigned_int>::size(&this->parent->pointerLocations);
  if (uVar1 < sVar2) {
    uVar1 = this->parentPointerLocationUsage;
    this->parentPointerLocationUsage = uVar1 + 1;
    puVar3 = kj::Vector<unsigned_int>::operator[](&this->parent->pointerLocations,(ulong)uVar1);
    this_local._4_4_ = *puVar3;
  }
  else {
    this->parentPointerLocationUsage = this->parentPointerLocationUsage + 1;
    this_local._4_4_ = Union::addNewPointerLocation(this->parent);
  }
  return this_local._4_4_;
}

Assistant:

uint addPointer() override {
      addMember();

      if (parentPointerLocationUsage < parent.pointerLocations.size()) {
        return parent.pointerLocations[parentPointerLocationUsage++];
      } else {
        parentPointerLocationUsage++;
        return parent.addNewPointerLocation();
      }
    }